

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O2

void duckdb::AggregateExecutor::
     UnaryUpdateLoop<duckdb::FirstState<duckdb::uhugeint_t>,duckdb::uhugeint_t,duckdb::FirstFunction<false,true>>
               (uhugeint_t *idata,AggregateInputData *aggr_input_data,
               FirstState<duckdb::uhugeint_t> *state,idx_t count,ValidityMask *mask,
               SelectionVector *sel_vector)

{
  sel_t *psVar1;
  idx_t i;
  idx_t iVar2;
  AggregateUnaryInput local_48;
  
  psVar1 = sel_vector->sel_vector;
  local_48.input = aggr_input_data;
  local_48.input_mask = mask;
  for (iVar2 = 0; count != iVar2; iVar2 = iVar2 + 1) {
    local_48.input_idx = iVar2;
    if (psVar1 != (sel_t *)0x0) {
      local_48.input_idx = (idx_t)psVar1[iVar2];
    }
    FirstFunction<false,true>::
    Operation<duckdb::uhugeint_t,duckdb::FirstState<duckdb::uhugeint_t>,duckdb::FirstFunction<false,true>>
              (state,idata + local_48.input_idx,&local_48);
  }
  return;
}

Assistant:

static inline void UnaryUpdateLoop(const INPUT_TYPE *__restrict idata, AggregateInputData &aggr_input_data,
	                                   STATE_TYPE *__restrict state, idx_t count, ValidityMask &mask,
	                                   const SelectionVector &__restrict sel_vector) {
		AggregateUnaryInput input(aggr_input_data, mask);
		if (OP::IgnoreNull() && !mask.AllValid()) {
			// potential NULL values and NULL values are ignored
			for (idx_t i = 0; i < count; i++) {
				input.input_idx = sel_vector.get_index(i);
				if (mask.RowIsValid(input.input_idx)) {
					OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*state, idata[input.input_idx], input);
				}
			}
		} else {
			// quick path: no NULL values or NULL values are not ignored
			for (idx_t i = 0; i < count; i++) {
				input.input_idx = sel_vector.get_index(i);
				OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*state, idata[input.input_idx], input);
			}
		}
	}